

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::TestCase::failed_test_count(TestCase *this)

{
  int iVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    iVar1 = internal::
            CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
                      (&this->test_info_list_,TestFailed);
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int TestCase::failed_test_count() const {
  return CountIf(test_info_list_, TestFailed);
}